

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_insertAndFindFirstIndexHash3(ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip)

{
  int iVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  
  pBVar2 = (ms->window).base;
  pUVar3 = ms->hashTable3;
  iVar1 = *(int *)ip;
  uVar5 = (int)ip - (int)pBVar2;
  bVar4 = 0x20 - (char)ms->hashLog3;
  for (uVar6 = (ulong)*nextToUpdate3; uVar6 < uVar5; uVar6 = uVar6 + 1) {
    pUVar3[(uint)(*(int *)(pBVar2 + uVar6) * 0x35a7bd00) >> (bVar4 & 0x1f)] = (U32)uVar6;
  }
  *nextToUpdate3 = uVar5;
  return pUVar3[(uint)(iVar1 * 0x35a7bd00) >> (bVar4 & 0x1f)];
}

Assistant:

static U32 ZSTD_insertAndFindFirstIndexHash3 (ZSTD_matchState_t* ms,
                                              U32* nextToUpdate3,
                                              const BYTE* const ip)
{
    U32* const hashTable3 = ms->hashTable3;
    U32 const hashLog3 = ms->hashLog3;
    const BYTE* const base = ms->window.base;
    U32 idx = *nextToUpdate3;
    U32 const target = (U32)(ip - base);
    size_t const hash3 = ZSTD_hash3Ptr(ip, hashLog3);
    assert(hashLog3 > 0);

    while(idx < target) {
        hashTable3[ZSTD_hash3Ptr(base+idx, hashLog3)] = idx;
        idx++;
    }

    *nextToUpdate3 = target;
    return hashTable3[hash3];
}